

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall hgdb::json::Module::~Module(Module *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_002af190;
  p_Var2 = (this->remove_inst_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->remove_inst_,(_Any_data *)&this->remove_inst_,__destroy_functor);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  ::~vector(&this->instances_);
  std::
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ::~vector(&this->variables_);
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_002af210;
  pcVar3 = (this->super_Scope<hgdb::json::Module>).condition._M_dataplus._M_p;
  paVar1 = &(this->super_Scope<hgdb::json::Module>).condition.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_Scope<hgdb::json::Module>).filename._M_dataplus._M_p;
  paVar1 = &(this->super_Scope<hgdb::json::Module>).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR___cxa_pure_virtual_002af250;
  std::
  vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ::~vector(&(this->super_Scope<hgdb::json::Module>).super_ScopeBase.scopes_);
  return;
}

Assistant:

Module(std::string name, std::function<void(const std::string &)> remove_func)
        : name_(std::move(name)), remove_inst_(std::move(remove_func)) {}